

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O0

void __thiscall rapidxml::xml_node<char>::append_node(xml_node<char> *this,xml_node<char> *child)

{
  node_type nVar1;
  xml_node<char> *pxVar2;
  bool bVar3;
  xml_node<char> *child_local;
  xml_node<char> *this_local;
  
  bVar3 = false;
  if (child != (xml_node<char> *)0x0) {
    pxVar2 = xml_base<char>::parent(&child->super_xml_base<char>);
    bVar3 = false;
    if (pxVar2 == (xml_node<char> *)0x0) {
      nVar1 = type(child);
      bVar3 = nVar1 != node_document;
    }
  }
  if (!bVar3) {
    __assert_fail("child && !child->parent() && child->type() != node_document",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/rapidxml-1.13/rapidxml.hpp"
                  ,1099,"void rapidxml::xml_node<>::append_node(xml_node<Ch> *) [Ch = char]");
  }
  pxVar2 = first_node(this,(char *)0x0,0,true);
  if (pxVar2 == (xml_node<char> *)0x0) {
    child->m_prev_sibling = (xml_node<char> *)0x0;
    this->m_first_node = child;
  }
  else {
    child->m_prev_sibling = this->m_last_node;
    this->m_last_node->m_next_sibling = child;
  }
  this->m_last_node = child;
  (child->super_xml_base<char>).m_parent = this;
  child->m_next_sibling = (xml_node<char> *)0x0;
  return;
}

Assistant:

void append_node(xml_node<Ch> *child)
        {
            assert(child && !child->parent() && child->type() != node_document);
            if (first_node())
            {
                child->m_prev_sibling = m_last_node;
                m_last_node->m_next_sibling = child;
            }
            else
            {
                child->m_prev_sibling = 0;
                m_first_node = child;
            }
            m_last_node = child;
            child->m_parent = this;
            child->m_next_sibling = 0;
        }